

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muse.c
# Opt level: O0

boolean munstone(monst *mon,boolean by_you)

{
  obj *local_28;
  obj *obj;
  boolean by_you_local;
  monst *mon_local;
  
  if (((((mon->mintrinsics & 0x80) == 0) && (mon->meating == 0)) &&
      ((*(uint *)&mon->field_0x60 >> 0x12 & 1) != 0)) &&
     ((*(uint *)&mon->field_0x60 >> 0x13 & 1) == 0)) {
    for (local_28 = mon->minvent; local_28 != (obj *)0x0; local_28 = local_28->nobj) {
      if ((local_28->otyp == 0x141) ||
         ((local_28->otyp == 0x10e &&
          ((local_28->corpsenm == 0x154 ||
           (((mons[local_28->corpsenm].mflags1 & 0x8000000) != 0 && (local_28->corpsenm != 0xd7)))))
          ))) {
        mon_consume_unstone(mon,local_28,by_you,'\x01');
        return '\x01';
      }
    }
  }
  return '\0';
}

Assistant:

boolean munstone(struct monst *mon, boolean by_you)
{
	struct obj *obj;

	if (resists_ston(mon)) return FALSE;
	if (mon->meating || !mon->mcanmove || mon->msleeping) return FALSE;

	for (obj = mon->minvent; obj; obj = obj->nobj) {
	    /* Monsters can also use potions of acid */
	    if ((obj->otyp == POT_ACID) || (obj->otyp == CORPSE &&
	    		(obj->corpsenm == PM_LIZARD || (acidic(&mons[obj->corpsenm]) && obj->corpsenm != PM_GREEN_SLIME)))) {
		mon_consume_unstone(mon, obj, by_you, TRUE);
		return TRUE;
	    }
	}
	return FALSE;
}